

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

void __thiscall bsim::quad_value::print(quad_value *this,ostream *out)

{
  ostream *in_RSI;
  char *in_RDI;
  
  if (*in_RDI == '\x01') {
    std::operator<<(in_RSI,"1");
  }
  else if (*in_RDI == '\0') {
    std::operator<<(in_RSI,"0");
  }
  else if (*in_RDI == '\x02') {
    std::operator<<(in_RSI,"x");
  }
  else if (*in_RDI == '\x03') {
    std::operator<<(in_RSI,"z");
  }
  return;
}

Assistant:

void print(std::ostream& out) const {
      if (value == 1) {
        out << "1";
      } else if (value == 0) {
        out << "0";
      } else if (value == QBV_UNKNOWN_VALUE) {
        out << "x";
      } else if (value == QBV_HIGH_IMPEDANCE_VALUE) {
        out << "z";
      }
    }